

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O2

int conn_accept(conn_handle *conn,conn_handle *accepted)

{
  mutex_handle *mutex;
  void *pvVar1;
  int iVar2;
  int *piVar3;
  
  piVar3 = (int *)conn->priv;
  pvVar1 = accepted->priv;
  *(undefined4 *)((long)pvVar1 + 0xc) = 0x80;
  mutex = (mutex_handle *)(piVar3 + 0x24);
  mutex_lock_shared(mutex);
  iVar2 = accept(*piVar3,(sockaddr *)((long)pvVar1 + 0x10),(socklen_t *)((long)pvVar1 + 0xc));
  *(int *)((long)pvVar1 + 4) = iVar2;
  mutex_unlock_shared(mutex);
  if ((((*(int *)((long)pvVar1 + 4) != -1) &&
       (iVar2 = setsockopt(*(int *)((long)pvVar1 + 4),1,9,&conn_accept::yes,4), iVar2 != -1)) &&
      (iVar2 = setsockopt(*(int *)((long)pvVar1 + 4),6,4,&conn_accept::ten_min,4), iVar2 != -1)) &&
     ((iVar2 = setsockopt(*(int *)((long)pvVar1 + 4),6,5,&conn_accept::twelve_sec,4), iVar2 != -1 &&
      (iVar2 = setsockopt(*(int *)((long)pvVar1 + 4),6,6,&conn_accept::ten,4), iVar2 != -1)))) {
    mutex_lock((mutex_handle *)((long)pvVar1 + 0x90));
    *(undefined4 *)((long)pvVar1 + 8) = *(undefined4 *)((long)pvVar1 + 4);
    mutex_unlock((mutex_handle *)((long)pvVar1 + 0x90));
    return 0;
  }
  piVar3 = __errno_location();
  return -*piVar3;
}

Assistant:

int conn_accept(struct conn_handle *conn, struct conn_handle *accepted)
{
	struct conn_priv *priv = conn->priv;
	struct conn_priv *apriv = accepted->priv;

#ifdef _WIN32
	uint32_t bytes_returned;
	struct tcp_keepalive keepalive = { 0 };

	keepalive.onoff = 1;
	keepalive.keepalivetime = 600 * 1000;
	keepalive.keepaliveinterval = 12 * 1000;
#else
	static const int yes = 1;
	static const int ten_min = 600;
	static const int twelve_sec = 12;
	static const int ten = 10;
#endif

	apriv->remote_addr_len = sizeof(apriv->remote_addr);

	mutex_lock_shared(&priv->mutex);

	apriv->conn_fd = accept(priv->sock_fd,
				(struct sockaddr *)&apriv->remote_addr,
				&apriv->remote_addr_len);

	mutex_unlock_shared(&priv->mutex);

	if (apriv->conn_fd == INVALID_SOCKET)
		return SOCK_ERRNO;

#ifdef _WIN32
	if (WSAIoctl(apriv->conn_fd, SIO_KEEPALIVE_VALS, &keepalive,
		     sizeof(keepalive), NULL, 0, &bytes_returned,
		     NULL, NULL) !=
	    0)
		/*! @TODO Close apriv->conn_fd */
		return SOCK_ERRNO;

#else
	if (setsockopt(apriv->conn_fd, SOL_SOCKET, SO_KEEPALIVE, &yes,
		       sizeof(yes)) == SOCKET_ERROR)
		/*! @TODO Close apriv->conn_fd */
		return SOCK_ERRNO;

	if (setsockopt(apriv->conn_fd, SOL_TCP, TCP_KEEPIDLE, &ten_min,
		       sizeof(ten_min)) == SOCKET_ERROR)
		/*! @TODO Close apriv->conn_fd */
		return SOCK_ERRNO;

	if (setsockopt(apriv->conn_fd, SOL_TCP, TCP_KEEPINTVL, &twelve_sec,
		       sizeof(twelve_sec)) == SOCKET_ERROR)
		/*! @TODO Close apriv->conn_fd */
		return SOCK_ERRNO;

	if (setsockopt(apriv->conn_fd, SOL_TCP, TCP_KEEPCNT, &ten,
		       sizeof(ten)) == SOCKET_ERROR)
		/*! @TODO Close apriv->conn_fd */
		return SOCK_ERRNO;

#endif

	mutex_lock(&apriv->mutex);

	apriv->fd = apriv->conn_fd;

	mutex_unlock(&apriv->mutex);

	return 0;
}